

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

ArchKind __thiscall llvm::ARM::parseCPUArch(ARM *this,StringRef CPU)

{
  char *pcVar1;
  bool bVar2;
  StringRef SVar3;
  char *local_e0;
  char *local_d8;
  undefined1 local_c0 [8];
  CpuNames<llvm::ARM::ArchKind> C;
  CpuNames<llvm::ARM::ArchKind> *__end1;
  CpuNames<llvm::ARM::ArchKind> *__begin1;
  CpuNames<llvm::ARM::ArchKind> (*__range1) [84];
  StringRef CPU_local;
  ARM *local_50;
  char *local_48;
  ARM **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  ARM *local_18;
  int local_c;
  
  pcVar1 = CPU.Data;
  __end1 = (CpuNames<llvm::ARM::ArchKind> *)&(anonymous_namespace)::CPUNames;
  C._24_8_ = (anonymous_namespace)::AArch64ARCHNames;
  while( true ) {
    if (__end1 == (CpuNames<llvm::ARM::ArchKind> *)C._24_8_) {
      return INVALID;
    }
    local_c0 = (undefined1  [8])__end1->NameCStr;
    C.NameCStr = (char *)__end1->NameLength;
    C.NameLength._0_4_ = __end1->ArchID;
    C.NameLength._4_1_ = __end1->Default;
    C.NameLength._5_3_ = *(undefined3 *)&__end1->field_0x15;
    C.ArchID = __end1->DefaultExtensions;
    C.Default = (bool)__end1->field_0x1c;
    C._21_3_ = *(undefined3 *)&__end1->field_0x1d;
    SVar3 = anon_unknown.dwarf_3ff1be::CpuNames<llvm::ARM::ArchKind>::getName
                      ((CpuNames<llvm::ARM::ArchKind> *)local_c0);
    local_e0 = SVar3.Data;
    local_d8 = (char *)SVar3.Length;
    local_38 = local_e0;
    local_30 = local_d8;
    local_40 = &local_50;
    bVar2 = false;
    local_50 = this;
    local_48 = pcVar1;
    if (pcVar1 == local_d8) {
      local_20 = local_e0;
      local_28 = local_d8;
      local_18 = this;
      if (local_d8 == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(this,local_e0,(size_t)local_d8);
      }
      bVar2 = local_c == 0;
    }
    if (bVar2) break;
    __end1 = __end1 + 1;
  }
  return (ArchKind)C.NameLength;
}

Assistant:

ARM::ArchKind llvm::ARM::parseCPUArch(StringRef CPU) {
  for (const auto C : CPUNames) {
    if (CPU == C.getName())
      return C.ArchID;
  }
  return ARM::ArchKind::INVALID;
}